

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<float>::LoadWeightedResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  float fVar1;
  pair<int,_int> *ppVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  float extraout_XMM0_Da;
  
  TPZFMatrix<float>::Resize(&this->fLocalWeightedResidual,(long)this->fNEquations,1);
  uVar3 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      lVar4 = (long)ppVar2[uVar5].first;
      fVar1 = (this->fWeights).super_TPZVec<float>.fStore[lVar4];
      (*(r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(r_global,(long)ppVar2[uVar5].second,0);
      if (((lVar4 < 0) ||
          ((this->fLocalWeightedResidual).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar4))
         || ((this->fLocalWeightedResidual).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (this->fLocalWeightedResidual).fElem[lVar4] = fVar1 * extraout_XMM0_Da;
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::LoadWeightedResidual(const TPZFMatrix<TVar> &r_global){
	int i;
	fLocalWeightedResidual.Resize(fNEquations,1);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		fLocalWeightedResidual(ind.first,0) = fWeights[ind.first]*r_global.GetVal(ind.second,0);
	}
}